

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc_tests.c
# Opt level: O1

void cjson_functions_shouldnt_crash_with_null_pointers(void)

{
  cJSON *parent;
  uchar *puVar1;
  char *pcVar2;
  cJSON *pcVar3;
  internal_hooks *hooks;
  internal_hooks *extraout_RDX;
  internal_hooks *extraout_RDX_00;
  internal_hooks *hooks_00;
  
  parent = cJSON_CreateString("item");
  global_hooks.allocate = malloc;
  global_hooks.deallocate = free;
  global_hooks.reallocate = realloc;
  global_error_0 = 0;
  global_error_1 = 0;
  puVar1 = print((cJSON *)0x0,1,hooks);
  hooks_00 = extraout_RDX;
  if (puVar1 != (uchar *)0x0) {
    UnityFail(" Expected NULL",0x165);
    hooks_00 = extraout_RDX_00;
  }
  puVar1 = print((cJSON *)0x0,0,hooks_00);
  if (puVar1 != (uchar *)0x0) {
    UnityFail(" Expected NULL",0x166);
  }
  pcVar2 = cJSON_PrintBuffered((cJSON *)0x0,10,1);
  if (pcVar2 != (char *)0x0) {
    UnityFail(" Expected NULL",0x167);
  }
  pcVar3 = (cJSON *)(*global_hooks.allocate)(0x40);
  if (pcVar3 != (cJSON *)0x0) {
    pcVar3->child = (cJSON *)0x0;
    *(undefined8 *)&pcVar3->type = 0;
    pcVar3->valuestring = (char *)0x0;
    *(undefined8 *)&pcVar3->valueint = 0;
    pcVar3->valuedouble = 0.0;
    pcVar3->string = (char *)0x0;
    pcVar3->next = (cJSON *)0x0;
    pcVar3->prev = (cJSON *)0x0;
    pcVar3->type = 0x10;
    pcVar3->valuestring = (char *)0x0;
    cJSON_Delete(pcVar3);
  }
  pcVar3 = (cJSON *)(*global_hooks.allocate)(0x40);
  if (pcVar3 != (cJSON *)0x0) {
    pcVar3->child = (cJSON *)0x0;
    *(undefined8 *)&pcVar3->type = 0;
    pcVar3->valuestring = (char *)0x0;
    *(undefined8 *)&pcVar3->valueint = 0;
    pcVar3->valuedouble = 0.0;
    pcVar3->string = (char *)0x0;
    pcVar3->next = (cJSON *)0x0;
    pcVar3->prev = (cJSON *)0x0;
    pcVar3->type = 0x80;
    pcVar3->valuestring = (char *)0x0;
    cJSON_Delete(pcVar3);
  }
  cJSON_Delete((cJSON *)0x0);
  pcVar3 = cJSON_DetachItemViaPointer(parent,(cJSON *)0x0);
  if (pcVar3 != (cJSON *)0x0) {
    UnityFail(" Expected NULL",0x195);
  }
  pcVar3 = cJSON_DetachItemViaPointer(parent,(cJSON *)0x0);
  if (pcVar3 != (cJSON *)0x0) {
    UnityFail(" Expected NULL",0x197);
  }
  cJSON_DeleteItemFromObject((cJSON *)0x0,"item");
  cJSON_DeleteItemFromObject(parent,(char *)0x0);
  cJSON_DeleteItemFromObjectCaseSensitive((cJSON *)0x0,"item");
  cJSON_DeleteItemFromObjectCaseSensitive(parent,(char *)0x0);
  cJSON_InsertItemInArray(parent,0,(cJSON *)0x0);
  replace_item_in_object((cJSON *)0x0,"item",parent,0);
  replace_item_in_object((cJSON *)0x0,"item",parent,1);
  cJSON_Delete(parent);
  return;
}

Assistant:

static void cjson_functions_shouldnt_crash_with_null_pointers(void)
{
    char buffer[10];
    cJSON *item = cJSON_CreateString("item");

    cJSON_InitHooks(NULL);
    TEST_ASSERT_NULL(cJSON_Parse(NULL));
    TEST_ASSERT_NULL(cJSON_ParseWithOpts(NULL, NULL, true));
    TEST_ASSERT_NULL(cJSON_Print(NULL));
    TEST_ASSERT_NULL(cJSON_PrintUnformatted(NULL));
    TEST_ASSERT_NULL(cJSON_PrintBuffered(NULL, 10, true));
    TEST_ASSERT_FALSE(cJSON_PrintPreallocated(NULL, buffer, sizeof(buffer), true));
    TEST_ASSERT_FALSE(cJSON_PrintPreallocated(item, NULL, 1, true));
    cJSON_Delete(NULL);
    cJSON_GetArraySize(NULL);
    TEST_ASSERT_NULL(cJSON_GetArrayItem(NULL, 0));
    TEST_ASSERT_NULL(cJSON_GetObjectItem(NULL, "item"));
    TEST_ASSERT_NULL(cJSON_GetObjectItem(item, NULL));
    TEST_ASSERT_NULL(cJSON_GetObjectItemCaseSensitive(NULL, "item"));
    TEST_ASSERT_NULL(cJSON_GetObjectItemCaseSensitive(item, NULL));
    TEST_ASSERT_FALSE(cJSON_HasObjectItem(NULL, "item"));
    TEST_ASSERT_FALSE(cJSON_HasObjectItem(item, NULL));
    TEST_ASSERT_FALSE(cJSON_IsInvalid(NULL));
    TEST_ASSERT_FALSE(cJSON_IsFalse(NULL));
    TEST_ASSERT_FALSE(cJSON_IsTrue(NULL));
    TEST_ASSERT_FALSE(cJSON_IsBool(NULL));
    TEST_ASSERT_FALSE(cJSON_IsNull(NULL));
    TEST_ASSERT_FALSE(cJSON_IsNumber(NULL));
    TEST_ASSERT_FALSE(cJSON_IsString(NULL));
    TEST_ASSERT_FALSE(cJSON_IsArray(NULL));
    TEST_ASSERT_FALSE(cJSON_IsObject(NULL));
    TEST_ASSERT_FALSE(cJSON_IsRaw(NULL));
    TEST_ASSERT_NULL(cJSON_CreateString(NULL));
    TEST_ASSERT_NULL(cJSON_CreateRaw(NULL));
    TEST_ASSERT_NULL(cJSON_CreateIntArray(NULL, 10));
    TEST_ASSERT_NULL(cJSON_CreateFloatArray(NULL, 10));
    TEST_ASSERT_NULL(cJSON_CreateDoubleArray(NULL, 10));
    TEST_ASSERT_NULL(cJSON_CreateStringArray(NULL, 10));
    cJSON_AddItemToArray(NULL, item);
    cJSON_AddItemToArray(item, NULL);
    cJSON_AddItemToObject(item, "item", NULL);
    cJSON_AddItemToObject(item, NULL, item);
    cJSON_AddItemToObject(NULL, "item", item);
    cJSON_AddItemToObjectCS(item, "item", NULL);
    cJSON_AddItemToObjectCS(item, NULL, item);
    cJSON_AddItemToObjectCS(NULL, "item", item);
    cJSON_AddItemReferenceToArray(NULL, item);
    cJSON_AddItemReferenceToArray(item, NULL);
    cJSON_AddItemReferenceToObject(item, "item", NULL);
    cJSON_AddItemReferenceToObject(item, NULL, item);
    cJSON_AddItemReferenceToObject(NULL, "item", item);
    TEST_ASSERT_NULL(cJSON_DetachItemViaPointer(NULL, item));
    TEST_ASSERT_NULL(cJSON_DetachItemViaPointer(item, NULL));
    TEST_ASSERT_NULL(cJSON_DetachItemFromArray(NULL, 0));
    cJSON_DeleteItemFromArray(NULL, 0);
    TEST_ASSERT_NULL(cJSON_DetachItemFromObject(NULL, "item"));
    TEST_ASSERT_NULL(cJSON_DetachItemFromObject(item, NULL));
    TEST_ASSERT_NULL(cJSON_DetachItemFromObjectCaseSensitive(NULL, "item"));
    TEST_ASSERT_NULL(cJSON_DetachItemFromObjectCaseSensitive(item, NULL));
    cJSON_DeleteItemFromObject(NULL, "item");
    cJSON_DeleteItemFromObject(item, NULL);
    cJSON_DeleteItemFromObjectCaseSensitive(NULL, "item");
    cJSON_DeleteItemFromObjectCaseSensitive(item, NULL);
    cJSON_InsertItemInArray(NULL, 0, item);
    cJSON_InsertItemInArray(item, 0, NULL);
    TEST_ASSERT_FALSE(cJSON_ReplaceItemViaPointer(NULL, item, item));
    TEST_ASSERT_FALSE(cJSON_ReplaceItemViaPointer(item, NULL, item));
    TEST_ASSERT_FALSE(cJSON_ReplaceItemViaPointer(item, item, NULL));
    cJSON_ReplaceItemInArray(item, 0, NULL);
    cJSON_ReplaceItemInArray(NULL, 0, item);
    cJSON_ReplaceItemInObject(NULL, "item", item);
    cJSON_ReplaceItemInObject(item, NULL, item);
    cJSON_ReplaceItemInObject(item, "item", NULL);
    cJSON_ReplaceItemInObjectCaseSensitive(NULL, "item", item);
    cJSON_ReplaceItemInObjectCaseSensitive(item, NULL, item);
    cJSON_ReplaceItemInObjectCaseSensitive(item, "item", NULL);
    TEST_ASSERT_NULL(cJSON_Duplicate(NULL, true));
    TEST_ASSERT_FALSE(cJSON_Compare(item, NULL, false));
    TEST_ASSERT_FALSE(cJSON_Compare(NULL, item, false));
    cJSON_Minify(NULL);
    /* skipped because it is only used via a macro that checks for NULL */
    /* cJSON_SetNumberHelper(NULL, 0); */

    cJSON_Delete(item);
}